

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O1

multi_ex * CSOAA::process_labels(multi_ex *__return_storage_ptr__,ldf *data,multi_ex *ec_seq_all)

{
  pointer *pppeVar1;
  float fVar2;
  example *peVar3;
  iterator __position;
  bool bVar4;
  ulong uVar5;
  pointer ppeVar6;
  wclass *pwVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  size_t j;
  features *pfVar11;
  features *pfVar12;
  ulong uVar13;
  byte bVar14;
  features new_fs;
  features local_98;
  
  bVar14 = 0;
  peVar3 = *(ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  bVar4 = ec_is_label_definition(peVar3);
  if (bVar4) {
    pfVar11 = (peVar3->super_example_predict).feature_space +
              *(peVar3->super_example_predict).indices._begin;
    pfVar12 = &local_98;
    for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pfVar12->values)._begin = (pfVar11->values)._begin;
      pfVar11 = (features *)((long)pfVar11 + ((ulong)bVar14 * -2 + 1) * 8);
      pfVar12 = (features *)((long)pfVar12 + ((ulong)bVar14 * -2 + 1) * 8);
    }
    pwVar7 = (peVar3->l).cs.costs._begin;
    if ((peVar3->l).cs.costs._end != pwVar7) {
      lVar9 = 0;
      uVar13 = 0;
      do {
        fVar2 = *(float *)((long)&pwVar7->x + lVar9);
        uVar5 = (ulong)fVar2;
        LabelDict::set_label_features
                  (&data->label_features,(long)(fVar2 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5,
                   &local_98);
        uVar13 = uVar13 + 1;
        pwVar7 = (peVar3->l).cs.costs._begin;
        lVar9 = lVar9 + 0x10;
      } while (uVar13 < (ulong)((long)(peVar3->l).cs.costs._end - (long)pwVar7 >> 4));
    }
    (__return_storage_ptr__->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppeVar6 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar6)) {
      uVar13 = 1;
      lVar9 = 8;
      do {
        peVar3 = ppeVar6[uVar13];
        bVar4 = ec_is_label_definition(peVar3);
        if (!bVar4) {
          ppeVar6 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar10 = (long)(ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar6;
          for (; uVar13 < (ulong)(lVar10 >> 3); uVar13 = uVar13 + 1) {
            __position._M_current =
                 (__return_storage_ptr__->super__Vector_base<example_*,_std::allocator<example_*>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->super__Vector_base<example_*,_std::allocator<example_*>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<example*,std::allocator<example*>>::_M_realloc_insert<example*const&>
                        ((vector<example*,std::allocator<example*>> *)__return_storage_ptr__,
                         __position,(example **)((long)ppeVar6 + lVar9));
            }
            else {
              *__position._M_current = *(example **)((long)ppeVar6 + lVar9);
              pppeVar1 = &(__return_storage_ptr__->
                          super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppeVar1 = *pppeVar1 + 1;
            }
            ppeVar6 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            lVar10 = (long)(ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar6;
            lVar9 = lVar9 + 8;
          }
          return __return_storage_ptr__;
        }
        pfVar11 = (peVar3->super_example_predict).feature_space +
                  *(peVar3->super_example_predict).indices._begin;
        pfVar12 = &local_98;
        for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pfVar12->values)._begin = (pfVar11->values)._begin;
          pfVar11 = (features *)((long)pfVar11 + ((ulong)bVar14 * -2 + 1) * 8);
          pfVar12 = (features *)((long)pfVar12 + (ulong)bVar14 * -0x10 + 8);
        }
        pwVar7 = (peVar3->l).cs.costs._begin;
        if ((peVar3->l).cs.costs._end != pwVar7) {
          lVar10 = 0;
          uVar5 = 0;
          do {
            fVar2 = *(float *)((long)&pwVar7->x + lVar10);
            uVar8 = (ulong)fVar2;
            LabelDict::set_label_features
                      (&data->label_features,
                       (long)(fVar2 - 9.223372e+18) & (long)uVar8 >> 0x3f | uVar8,&local_98);
            uVar5 = uVar5 + 1;
            pwVar7 = (peVar3->l).cs.costs._begin;
            lVar10 = lVar10 + 0x10;
          } while (uVar5 < (ulong)((long)(peVar3->l).cs.costs._end - (long)pwVar7 >> 4));
        }
        uVar13 = uVar13 + 1;
        ppeVar6 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar9 = lVar9 + 8;
      } while (uVar13 < (ulong)((long)(ec_seq_all->
                                      super__Vector_base<example_*,_std::allocator<example_*>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar6 >> 3
                               ));
    }
  }
  else {
    std::vector<example_*,_std::allocator<example_*>_>::vector(__return_storage_ptr__,ec_seq_all);
  }
  return __return_storage_ptr__;
}

Assistant:

multi_ex process_labels(ldf& data, const multi_ex& ec_seq_all)
{
  example* ec = ec_seq_all[0];

  // check the first element, if it's not a label, return
  if (!ec_is_label_definition(*ec))
    return ec_seq_all;

  // process the first element as a label
  process_label(data, ec);

  multi_ex ret;
  size_t i = 1;
  // process the rest of the elements that are labels
  for (; i < ec_seq_all.size(); i++)
  {
    ec = ec_seq_all[i];
    if (!ec_is_label_definition(*ec))
    {
      for (size_t j = i; j < ec_seq_all.size(); j++) ret.push_back(ec_seq_all[j]);
      // return index of the first element that is not a label
      return ret;
    }

    process_label(data, ec);
  }

  // all examples were labels return size
  return ret;
}